

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tree_data_new.c
# Opt level: O1

LY_ERR lyd_new_attr(lyd_node *parent,char *module_name,char *name,char *value,lyd_attr **attr)

{
  ly_ctx *ctx;
  char *name_00;
  LY_ERR LVar1;
  int iVar2;
  size_t module_key_len;
  size_t value_len;
  char *__s;
  char *pcVar3;
  size_t pref_len;
  char *prefix;
  char *name_local;
  size_t name_len;
  lyd_attr *ret;
  char *local_50;
  size_t local_48;
  size_t local_40;
  char *tmp;
  
  ret = (lyd_attr *)0x0;
  name_local = name;
  if (parent == (lyd_node *)0x0) {
    pcVar3 = "parent";
  }
  else if (parent->schema == (lysc_node *)0x0) {
    if (name != (char *)0x0) {
      ctx = (ly_ctx *)parent[2].schema;
      tmp = name;
      LVar1 = ly_parse_nodeid(&tmp,&prefix,&pref_len,&name_local,&name_len);
      pcVar3 = prefix;
      if ((LVar1 != LY_SUCCESS) || (*tmp != '\0')) {
        ly_log(ctx,LY_LLERR,LY_EINVAL,"Attribute name \"%s\" is not valid.",name_local);
        return LY_EVALID;
      }
      if ((pref_len == 3) && (iVar2 = strncmp(prefix,"xml",3), iVar2 == 0)) {
        name_local = pcVar3;
        name_len = name_len + 4;
        prefix = (char *)0x0;
        pref_len = 0;
      }
      module_key_len = pref_len;
      pcVar3 = prefix;
      if (module_name != (char *)0x0) {
        module_key_len = strlen(module_name);
        pcVar3 = module_name;
      }
      name_00 = name_local;
      __s = "";
      if (value != (char *)0x0) {
        __s = value;
      }
      local_48 = name_len;
      local_50 = prefix;
      local_40 = pref_len;
      value_len = strlen(__s);
      LVar1 = lyd_create_attr(parent,&ret,ctx,name_00,local_48,local_50,local_40,pcVar3,
                              module_key_len,__s,value_len,(ly_bool *)0x0,LY_VALUE_JSON,(void *)0x0,
                              0x3f3);
      if (LVar1 != LY_SUCCESS) {
        return LVar1;
      }
      if (attr != (lyd_attr **)0x0) {
        *attr = ret;
      }
      return LY_SUCCESS;
    }
    pcVar3 = "name";
  }
  else {
    pcVar3 = "!parent->schema";
  }
  ly_log((ly_ctx *)0x0,LY_LLERR,LY_EINVAL,"Invalid argument %s (%s()).",pcVar3,"lyd_new_attr");
  return LY_EINVAL;
}

Assistant:

LIBYANG_API_DEF LY_ERR
lyd_new_attr(struct lyd_node *parent, const char *module_name, const char *name, const char *value,
        struct lyd_attr **attr)
{
    struct lyd_attr *ret = NULL;
    const struct ly_ctx *ctx;
    const char *prefix, *tmp;
    size_t pref_len, name_len, mod_len;

    LY_CHECK_ARG_RET(NULL, parent, !parent->schema, name, LY_EINVAL);

    ctx = LYD_CTX(parent);

    /* parse the name */
    tmp = name;
    if (ly_parse_nodeid(&tmp, &prefix, &pref_len, &name, &name_len) || tmp[0]) {
        LOGERR(ctx, LY_EINVAL, "Attribute name \"%s\" is not valid.", name);
        return LY_EVALID;
    }

    if ((pref_len == 3) && !strncmp(prefix, "xml", 3)) {
        /* not a prefix but special name */
        name = prefix;
        name_len += 1 + pref_len;
        prefix = NULL;
        pref_len = 0;
    }

    /* get the module */
    if (module_name) {
        mod_len = strlen(module_name);
    } else {
        module_name = prefix;
        mod_len = pref_len;
    }

    /* set value if none */
    if (!value) {
        value = "";
    }

    LY_CHECK_RET(lyd_create_attr(parent, &ret, ctx, name, name_len, prefix, pref_len, module_name, mod_len, value,
            strlen(value), NULL, LY_VALUE_JSON, NULL, LYD_HINT_DATA));

    if (attr) {
        *attr = ret;
    }
    return LY_SUCCESS;
}